

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

StackChecker<duckdb::ExpressionBinder> __thiscall
duckdb::ExpressionBinder::StackCheck
          (ExpressionBinder *this,ParsedExpression *expr,idx_t extra_stack)

{
  ClientConfig *pCVar1;
  ulong uVar2;
  BinderException *this_00;
  long in_RCX;
  idx_t extraout_RDX;
  StackChecker<duckdb::ExpressionBinder> SVar3;
  allocator local_49;
  string local_48;
  
  pCVar1 = ClientConfig::GetConfig(*(ClientContext **)&expr[1].super_BaseExpression.type);
  uVar2 = (expr->super_BaseExpression).query_location.index + in_RCX;
  if (uVar2 < pCVar1->max_expression_depth) {
    this->_vptr_ExpressionBinder = (_func_int **)expr;
    (this->target_type).id_ = (char)in_RCX;
    (this->target_type).physical_type_ = (char)((ulong)in_RCX >> 8);
    *(int6 *)&(this->target_type).field_0x2 = (int6)((ulong)in_RCX >> 0x10);
    (expr->super_BaseExpression).query_location.index = uVar2;
    SVar3.stack_usage = extraout_RDX;
    SVar3.recursive_class = this;
    return SVar3;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to increase the maximum expression depth."
             ,&local_49);
  BinderException::BinderException<unsigned_long>(this_00,&local_48,pCVar1->max_expression_depth);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

StackChecker<ExpressionBinder> ExpressionBinder::StackCheck(const ParsedExpression &expr, idx_t extra_stack) {
	D_ASSERT(stack_depth != DConstants::INVALID_INDEX);
	auto &options = ClientConfig::GetConfig(context);
	if (stack_depth + extra_stack >= options.max_expression_depth) {
		throw BinderException("Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to "
		                      "increase the maximum expression depth.",
		                      options.max_expression_depth);
	}
	return StackChecker<ExpressionBinder>(*this, extra_stack);
}